

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringutils.h
# Opt level: O0

string * hexdump<unsigned_char_const*>
                   (string *__return_storage_ptr__,uchar *buf,int nLength,int nDumpUnitSize,
                   EndianType et)

{
  bool bVar1;
  allocator<char> local_36;
  allocator<char> local_35;
  int nCharsInResult;
  allocator<char> local_25;
  EndianType local_24;
  int local_20;
  EndianType et_local;
  int nDumpUnitSize_local;
  int nLength_local;
  uchar *buf_local;
  string *line;
  
  local_24 = et;
  local_20 = nDumpUnitSize;
  et_local = nLength;
  _nDumpUnitSize_local = buf;
  buf_local = (uchar *)__return_storage_ptr__;
  if (nLength < 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"hexdump-ERROR",&local_25);
    std::allocator<char>::~allocator(&local_25);
  }
  else if ((nLength < 1) || (bVar1 = isnullptr<unsigned_char>(buf), !bVar1)) {
    if (et_local == ET_BIGENDIAN) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",&local_36);
      std::allocator<char>::~allocator(&local_36);
    }
    else {
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
      if (local_24 == ET_LITTLEENDIAN) {
        switch(local_20) {
        case 1:
          hexdumpbytes<unsigned_char_const*>
                    (__return_storage_ptr__,_nDumpUnitSize_local,(long)(int)et_local,' ');
          break;
        case 2:
          hexdumpwords<unsigned_char_const*>
                    (__return_storage_ptr__,_nDumpUnitSize_local,(long)(int)et_local,' ');
          break;
        case 4:
          hexdumpdwords<unsigned_char_const*>
                    (__return_storage_ptr__,_nDumpUnitSize_local,(long)(int)et_local,' ');
          break;
        case 8:
          hexdumpqwords<unsigned_char_const*>
                    (__return_storage_ptr__,_nDumpUnitSize_local,(long)(int)et_local);
        }
      }
      else {
        hexdumpgroups<unsigned_char_const*>
                  (__return_storage_ptr__,_nDumpUnitSize_local,(long)(int)(et_local * local_20),
                   local_20,' ');
      }
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"(null)",&local_35);
    std::allocator<char>::~allocator(&local_35);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string hexdump(I buf, int nLength, int nDumpUnitSize=1, enum EndianType et=ET_LITTLEENDIAN )
{
    if (nLength<0)
        return "hexdump-ERROR";
    if (nLength>0 && isnullptr(buf))
        return "(null)";
    if (nLength==0)
        return "";

    int nCharsInResult= nLength*(nDumpUnitSize==1?3:
                                 nDumpUnitSize==2?5:
                                 nDumpUnitSize==4?9:
                                 nDumpUnitSize==8?17:
                                 9);
    std::string line;

    line.reserve(nCharsInResult);

    if (et==ET_LITTLEENDIAN)
        switch(nDumpUnitSize)
        {
            case 1: hexdumpbytes(line, buf, nLength); break;
            case 2: hexdumpwords(line, buf, nLength); break;
            case 4: hexdumpdwords(line, buf, nLength); break;
            case 8: hexdumpqwords(line, buf, nLength); break;
        }
    else {
        hexdumpgroups(line, buf, nLength*nDumpUnitSize, nDumpUnitSize);
    }
    return line;
}